

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_ascii.c
# Opt level: O1

void * receiver(void *_)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  byte bVar5;
  int j;
  long lVar6;
  int iVar7;
  timespec t0;
  timespec local_40;
  
  clock_gettime(1,&local_40);
  iVar7 = 0;
  do {
    sched_yield();
    sVar4 = (*meassure)((_func_void *)0x11d098);
    bVar2 = threshhold < sVar4 != (method == 0);
    if (iVar7 < 7) {
      iVar1 = 0;
      if ((uint)bVar2 != iVar7 % 2) {
        iVar1 = iVar7 + 1;
      }
LAB_001014a0:
      iVar7 = iVar1;
      uVar3 = (int)local_40.tv_nsec + (int)interval;
      bVar2 = true;
      if (999999999 < uVar3) {
        uVar3 = uVar3 + 0xc4653600;
        local_40.tv_sec = local_40.tv_sec + 1;
      }
    }
    else {
      if (!bVar2) {
        iVar1 = iVar7 + -2;
        goto LAB_001014a0;
      }
      uVar3 = (int)local_40.tv_nsec + (int)interval;
      if (999999999 < uVar3) {
        uVar3 = uVar3 + 0xc4653600;
        local_40.tv_sec = local_40.tv_sec + 1;
      }
      bVar2 = false;
    }
    local_40.tv_nsec = (long)uVar3;
    clock_nanosleep(1,1,&local_40,(timespec *)0x0);
    if (!bVar2) {
      lVar6 = 0;
      do {
        sched_yield();
        sVar4 = (*meassure)((_func_void *)0x11d098);
        frame.mac_addr[lVar6] = sVar4;
        uVar3 = (int)local_40.tv_nsec + (int)interval;
        if (999999999 < uVar3) {
          uVar3 = uVar3 + 0xc4653600;
          local_40.tv_sec = local_40.tv_sec + 1;
        }
        local_40.tv_nsec = (long)uVar3;
        clock_nanosleep(1,1,&local_40,(timespec *)0x0);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x70);
      bVar5 = 0xf;
      lVar6 = 0;
      do {
        length = length | (uint)(threshhold < frame.length[lVar6] != (method == 0)) <<
                          (bVar5 & 0x1f);
        lVar6 = lVar6 + 1;
        bVar5 = bVar5 - 1;
      } while (lVar6 != 0x10);
      if (length - 0x5dd < 0xfffffffffffffa51) {
        length = 0;
      }
      else {
        sched_yield();
        frame.payload[0] = (*meassure)((_func_void *)0x11d098);
        if (length != 1) {
          lVar6 = 0xb1;
          do {
            uVar3 = (int)local_40.tv_nsec + (int)interval;
            if (999999999 < uVar3) {
              uVar3 = uVar3 + 0xc4653600;
              local_40.tv_sec = local_40.tv_sec + 1;
            }
            local_40.tv_nsec = (long)uVar3;
            clock_nanosleep(1,1,&local_40,(timespec *)0x0);
            sched_yield();
            sVar4 = (*meassure)((_func_void *)0x11d098);
            frame.sync[lVar6] = sVar4;
            sVar4 = lVar6 - 0xaf;
            lVar6 = lVar6 + 1;
          } while (sVar4 != length);
        }
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void* receiver(void* _)
{
    INIT_CLOCK
    int i = 0;
    int preamble_counter = 0;
    while(1)
    {
        sched_yield();
        size_t d = meassure(function + 64);
        d = eval(d);

        if(preamble_counter < 0 * 8 + 7)
        {
            if(d == preamble_counter % 2)
            {
                // wrong sync bit
                preamble_counter = 0;
            }
            else
            {
                // correct sync bit
                preamble_counter++;
            }
        }
        else
        {
            if(d == 1)
            {
                // preamble done
                WAIT_FOR_CLOCK
                break;
            }
            else
            {
                // still in Sync
                preamble_counter -= 2;
            }
        }

        WAIT_FOR_CLOCK
    }

    for(int j = 0; j < (6 + 6 + 2) * 8; j++)
    {
        sched_yield();
        size_t d = meassure(function + 64);

        frame.mac_addr[j] = d;
        WAIT_FOR_CLOCK;
    }

    // retrieve length
    for(int i=0; i<16; i++)
    {
        length |= eval(frame.length[i])<<(15-i);
    }

    if(length > 1500 || length < 46)
    {
        // fprintf(stderr, "Length faulty: %d announced\n", length);
        length = 0;
        return NULL;        
    }

    while(1)
    {
        sched_yield();
        size_t d = meassure(function + 64);

        frame.payload[i++] = d;

        if(i == length)
            return NULL;

        WAIT_FOR_CLOCK
    }
}